

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O1

boolean can_advance(int skill,boolean speedy)

{
  char cVar1;
  boolean bVar2;
  uint uVar3;
  int tmp;
  int iVar4;
  
  cVar1 = u.weapon_skills[skill].skill;
  iVar4 = (int)cVar1;
  if ((cVar1 == '\0') || (u.weapon_skills[skill].max_skill <= cVar1)) {
    return '\0';
  }
  if ((speedy == '\0') || (bVar2 = '\x01', flags.debug == '\0')) {
    uVar3 = iVar4 * iVar4 * 0x14;
    if (6 < skill - 0x1eU) {
      uVar3 = 100 << (cVar1 - 1U & 0x1f);
    }
    bVar2 = '\0';
    if ((uVar3 <= u.weapon_skills[skill].advance) && (bVar2 = '\0', u.skills_advanced < 0x3c)) {
      if (skill != 0x26 && 0x1d < skill) {
        iVar4 = (int)(char)((iVar4 - (iVar4 + 1 >> 0x1f)) + 1U >> 1);
      }
      return iVar4 <= u.weapon_slots;
    }
  }
  return bVar2;
}

Assistant:

boolean can_advance(int skill, boolean speedy)
{
    return !P_RESTRICTED(skill)
	    && P_SKILL(skill) < P_MAX_SKILL(skill) && (
	    (wizard && speedy) || (P_ADVANCE(skill) >=
		(unsigned) practice_needed_to_advance(skill, P_SKILL(skill))
	    && u.skills_advanced < P_SKILL_LIMIT
	    && u.weapon_slots >= slots_required(skill)));
}